

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfSubscriber.c
# Opt level: O0

void timerCb(sbfTimer timer,void *closure)

{
  ulong local_30;
  uint64_t local_20;
  
  if (gTimeLow == 0xffffffffffffffff) {
    local_20 = 0;
  }
  else {
    local_20 = gTimeLow;
  }
  if (gMessages == 0) {
    local_30 = 0;
  }
  else {
    local_30 = gTimeTotal / gMessages;
  }
  printf("%u low=%llu average=%llu high=%llu\n",(ulong)gMessages,local_20,local_30,gTimeHigh);
  fflush(_stdout);
  gMessages = 0;
  gTimeLow = 0xffffffffffffffff;
  gTimeTotal = 0;
  gTimeHigh = 0;
  return;
}

Assistant:

static void
timerCb (sbfTimer timer, void* closure)
{
    printf ("%u low=%llu average=%llu high=%llu" SBF_EOL,
            gMessages,
            gTimeLow == UINT64_MAX ? 0 : (unsigned long long)gTimeLow,
            gMessages == 0 ? 0 : (unsigned long long)gTimeTotal / gMessages,
            (unsigned long long)gTimeHigh);
    fflush (stdout);

    gMessages = 0;
    gTimeLow = UINT64_MAX;
    gTimeTotal = 0;
    gTimeHigh = 0;
}